

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O2

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
::~AssignmentOnSelf(AssignmentOnSelf<phmap::flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
                    *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign.
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}